

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acb.h
# Opt level: O0

void Acb_ObjDeleteFaninIndex(Acb_Ntk_t *p,int iObj,int iFaninIndex)

{
  int *piVar1;
  int *pFanins;
  int i;
  int iFaninIndex_local;
  int iObj_local;
  Acb_Ntk_t *p_local;
  
  piVar1 = Acb_ObjFanins(p,iObj);
  *piVar1 = *piVar1 + -1;
  for (pFanins._4_4_ = iFaninIndex; pFanins._4_4_ < *piVar1; pFanins._4_4_ = pFanins._4_4_ + 1) {
    piVar1[pFanins._4_4_ + 1] = piVar1[pFanins._4_4_ + 2];
  }
  piVar1[*piVar1 + 1] = -1;
  return;
}

Assistant:

static inline void Acb_ObjDeleteFaninIndex( Acb_Ntk_t * p, int iObj, int iFaninIndex )
{
    int i, * pFanins = Acb_ObjFanins( p, iObj );
    pFanins[0]--;
    for ( i = iFaninIndex; i < pFanins[0]; i++ )
        pFanins[ 1 + i ] = pFanins[ 2 + i ];
    pFanins[ 1 + pFanins[0] ] = -1;
}